

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer *this_00;
  reference ppPVar4;
  DataType *this_01;
  TextLocation *initLoc;
  TextLocation *loc;
  PseudoOptType *in_RDX;
  undefined1 local_100 [16];
  unique_ptr<const_yactfr::OptionalWithBooleanSelectorType,_std::default_delete<const_yactfr::OptionalWithBooleanSelectorType>_>
  local_f0;
  PseudoDt *local_e8;
  undefined1 local_e0 [8];
  Up containedDt;
  allocator local_c1;
  string local_c0;
  PseudoScalarDtWrapper *local_a0;
  PseudoDt *pseudoSelDt;
  iterator __end2;
  iterator __begin2;
  unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
  *__range2;
  _tPseudoDtSels selLocPseudoDtsPair;
  PseudoOptType *pseudoOptType;
  PseudoDt *pseudoDt_local;
  DtFromPseudoRootDtConverter *this_local;
  
  uVar2 = PseudoTraceType::majorVersion((PseudoTraceType *)(pseudoDt->_loc)._lineNumber);
  if (uVar2 != 2) {
    __assert_fail("_pseudoTraceType->majorVersion() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3c6,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType(const PseudoDt &)"
                 );
  }
  selLocPseudoDtsPair.second._M_h._M_single_bucket = (__node_base_ptr)in_RDX;
  _pseudoDtSels<yactfr::internal::PseudoOptType>
            ((_tPseudoDtSels *)&__range2,(DtFromPseudoRootDtConverter *)pseudoDt,in_RDX);
  this_00 = &selLocPseudoDtsPair.first._pathElems.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::
           unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
           ::begin((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                    *)this_00);
  pseudoSelDt = (PseudoDt *)
                std::
                unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                ::end((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                       *)this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<const_yactfr::internal::PseudoDt_*,_false>,
                       (_Node_iterator_base<const_yactfr::internal::PseudoDt_*,_false> *)
                       &pseudoSelDt);
    if (!bVar1) {
      local_e8 = pseudoDt;
      _whileVisitingPseudoDt<yactfr::internal::PseudoOptType,yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType(yactfr::internal::PseudoDt_const&)::__0>
                ((DtFromPseudoRootDtConverter *)local_e0,(PseudoOptType *)pseudoDt,
                 (anon_class_8_1_8991fb9c *)selLocPseudoDtsPair.second._M_h._M_single_bucket);
      local_100._12_4_ = 1;
      WithAttrsMixin::attrs
                ((WithAttrsMixin *)(selLocPseudoDtsPair.second._M_h._M_single_bucket + 6));
      tryCloneAttrs((MapItem *)local_100);
      OptionalWithBooleanSelectorType::
      create<int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((int *)&local_f0,
                 (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *
                 )(local_100 + 0xc),(DataLocation *)local_e0,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 &__range2);
      std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
      unique_ptr<yactfr::OptionalWithBooleanSelectorType_const,std::default_delete<yactfr::OptionalWithBooleanSelectorType_const>,void>
                ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)
                 this,&local_f0);
      std::
      unique_ptr<const_yactfr::OptionalWithBooleanSelectorType,_std::default_delete<const_yactfr::OptionalWithBooleanSelectorType>_>
      ::~unique_ptr(&local_f0);
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_100);
      std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::
      ~unique_ptr((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                   *)local_e0);
      std::
      pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
      ::~pair((pair<yactfr::DataLocation,_std::unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>_>
               *)&__range2);
      return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
              )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
                )this;
    }
    ppPVar4 = std::__detail::_Node_iterator<const_yactfr::internal::PseudoDt_*,_true,_false>::
              operator*(&__end2);
    local_a0 = (PseudoScalarDtWrapper *)*ppPVar4;
    iVar3 = (*(local_a0->super_PseudoDt)._vptr_PseudoDt[2])();
    if (iVar3 != 0) break;
    this_01 = PseudoScalarDtWrapper::dt(local_a0);
    bVar1 = DataType::isFixedLengthBooleanType(this_01);
    if (!bVar1) break;
    std::__detail::_Node_iterator<const_yactfr::internal::PseudoDt_*,_true,_false>::operator++
              (&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c0,"Selector type of optional type isn\'t a boolean type.",&local_c1);
  initLoc = PseudoDt::loc(&local_a0->super_PseudoDt);
  loc = PseudoDt::loc(&in_RDX->super_PseudoDt);
  _throwInvalDataLoc((DtFromPseudoRootDtConverter *)pseudoDt,&local_c0,initLoc,
                     (DataLocation *)&__range2,loc);
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType(const PseudoDt& pseudoDt)
{
    assert(_pseudoTraceType->majorVersion() == 2);

    auto& pseudoOptType = static_cast<const PseudoOptType&>(pseudoDt);
    auto selLocPseudoDtsPair = this->_pseudoDtSels(pseudoOptType);

    for (const auto pseudoSelDt : selLocPseudoDtsPair.second) {
        if (pseudoSelDt->kind() != PseudoDt::Kind::ScalarDtWrapper ||
                !static_cast<const PseudoScalarDtWrapper&>(*pseudoSelDt).dt().isFixedLengthBooleanType()) {
            this->_throwInvalDataLoc("Selector type of optional type isn't a boolean type.",
                                     pseudoSelDt->loc(), selLocPseudoDtsPair.first, pseudoDt.loc());
        }
    }

    auto containedDt = this->_whileVisitingPseudoDt(pseudoOptType, [this](auto& pseudoOptType) {
        return this->_dtFromPseudoDt(pseudoOptType.pseudoDt());
    });

    return OptionalWithBooleanSelectorType::create(1, std::move(containedDt),
                                                   std::move(selLocPseudoDtsPair.first),
                                                   tryCloneAttrs(pseudoOptType.attrs()));
}